

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_base_entry_range_operation<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
               (void)

{
  long lVar1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  vector<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>
  range;
  generic_hook<(boost::intrusive::algo_types)0,_boost::intrusive::list_node_traits<void_*>,_Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>::Matrix_column_tag,_(boost::intrusive::link_mode_type)1,_(boost::intrusive::base_hook_type)1>
  local_a8;
  undefined4 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined4 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_68;
  Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_> m;
  
  build_general_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>::
  Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>> *)&m,
             &columns,5);
  range.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  range.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  range.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90 = 0;
  uStack_88 = 0;
  local_98 = 0;
  local_a8.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  local_a8.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  local_80 = 1;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 4;
  std::
  vector<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>>
  ::
  _M_assign_aux<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>const*>
            ((vector<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>>
              *)&range,&local_a8);
  lVar1 = 0x30;
  do {
    boost::intrusive::
    generic_hook<(boost::intrusive::algo_types)0,_boost::intrusive::list_node_traits<void_*>,_Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>::Matrix_column_tag,_(boost::intrusive::link_mode_type)1,_(boost::intrusive::base_hook_type)1>
    ::~generic_hook((generic_hook<(boost::intrusive::algo_types)0,_boost::intrusive::list_node_traits<void_*>,_Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>::Matrix_column_tag,_(boost::intrusive::link_mode_type)1,_(boost::intrusive::base_hook_type)1>
                     *)((long)&local_a8.super_type.super_list_node<void_*>.next_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
            (&columns,&m);
  local_a8.super_type.super_list_node<void_*>.next_ =
       (node_ptr)CONCAT44(local_a8.super_type.super_list_node<void_*>.next_._4_4_,1);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             (columns.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 10),&local_a8);
  Gudhi::persistence_matrix::
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
  ::
  add_to<std::vector<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>>>
            ((Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
              *)&m.matrix_,&range,10);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
            (&columns,&m);
  local_a8.super_type.super_list_node<void_*>.next_ = (node_ptr)0x200000000;
  local_a8.super_type.super_list_node<void_*>.prev_ =
       (node_ptr)CONCAT44(local_a8.super_type.super_list_node<void_*>.prev_._4_4_,4);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             (columns.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 5),&local_a8);
  Gudhi::persistence_matrix::
  Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>::
  multiply_target_and_add_to<std::vector<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>>>
            ((Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>> *)&m,
             &range,3,5);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
            (&columns,&m);
  local_a8.super_type.super_list_node<void_*>.next_ =
       (node_ptr)CONCAT44(local_a8.super_type.super_list_node<void_*>.next_._4_4_,1);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             (columns.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 6),&local_a8);
  Gudhi::persistence_matrix::
  Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>::
  multiply_source_and_add_to<std::vector<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>>>
            ((Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>> *)&m,
             3,&range,6);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
            (&columns,&m);
  std::
  vector<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>
  ::~vector(&range);
  Gudhi::persistence_matrix::
  Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>::~Matrix(&m);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_base_entry_range_operation() {
  using Entry = typename Matrix::Matrix_entry;

  auto columns = build_general_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  std::vector<Entry> range;
  range = {Entry(0), Entry(1), Entry(4)};
  if constexpr (!Matrix::Option_list::is_z2) {
    range[0].set_element(1);
    range[1].set_element(4);
    range[2].set_element(1);
  }

  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::is_z2) {
    columns[10] = {1};
  } else {
    columns[10] = {{0, 2}, {1, 4}};
  }
  m.add_to(range, 10);
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::is_z2) {
    columns[5] = {0, 2, 4};
  } else {
    columns[5] = {{0, 1}, {1, 2}, {2, 2}, {4, 1}};
  }
  m.multiply_target_and_add_to(range, 3, 5);
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::is_z2) {
    columns[6] = {1};
  } else {
    columns[6] = {{0, 4}, {1, 2}, {4, 2}};
  }
  m.multiply_source_and_add_to(3, range, 6);
  test_content_equality(columns, m);
}